

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::print(Board *this,uint moves)

{
  ostream *poVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  byte *pbVar4;
  int *piVar5;
  byte local_b1;
  undefined1 local_b0 [7];
  dimension y_2;
  int local_90;
  uint local_8c;
  string local_88;
  string local_68;
  string local_38;
  byte local_17;
  byte local_16;
  byte local_15;
  uint local_14;
  dimension y_1;
  dimension x;
  dimension y;
  Board *pBStack_10;
  uint moves_local;
  Board *this_local;
  
  local_14 = moves;
  pBStack_10 = this;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"--= Board =--");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"  ");
  for (local_15 = 0; local_15 < this->m_height; local_15 = local_15 + 1) {
    print_index(local_15);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  for (local_16 = 0; local_16 < this->m_width; local_16 = local_16 + 1) {
    print_index(local_16);
    for (local_17 = 0; local_17 < this->m_height; local_17 = local_17 + 1) {
      pvVar2 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&this->m_board,(ulong)local_16);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pvVar2,(ulong)local_17);
      if (*pvVar3 == 'j') {
        std::operator<<((ostream *)&std::cout,"\x1b[1mJK\x1b[0m");
      }
      else if ((local_16 == (this->m_position).first) && (local_17 == (this->m_position).second)) {
        poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[");
        pvVar2 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](&this->m_board,(ulong)local_16);
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (pvVar2,(ulong)local_17);
        pbVar4 = std::
                 map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                 ::at(&color_codes,pvVar3);
        std::__cxx11::to_string(&local_38,*pbVar4 + 0x1e);
        poVar1 = std::operator<<(poVar1,(string *)&local_38);
        poVar1 = std::operator<<(poVar1,"m");
        local_8c = local_14;
        local_90 = 99;
        piVar5 = std::min<int>((int *)&local_8c,&local_90);
        std::__cxx11::to_string(&local_88,*piVar5);
        zfill(&local_68,&local_88,2,'0');
        poVar1 = std::operator<<(poVar1,(string *)&local_68);
        std::operator<<(poVar1,"\x1b[0m");
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_38);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[");
        pvVar2 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](&this->m_board,(ulong)local_16);
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (pvVar2,(ulong)local_17);
        pbVar4 = std::
                 map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                 ::at(&color_codes,pvVar3);
        std::__cxx11::to_string((string *)local_b0,*pbVar4 + 0x28);
        poVar1 = std::operator<<(poVar1,(string *)local_b0);
        std::operator<<(poVar1,"m  \x1b[0m");
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    print_index(local_16);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"  ");
  for (local_b1 = 0; local_b1 < this->m_height; local_b1 = local_b1 + 1) {
    print_index(local_b1);
  }
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Board::print(const unsigned int moves) const {
    // Display title.
    cout << endl << "--= Board =--" << endl;

    // Display upper indexes (X axis).
    cout << "  ";
    for (dimension y = 0; y < m_height; y++) print_index(y);
    cout << endl;

    // Display board.
    for (dimension x = 0; x < m_width; x++) {
        // Display left index (Y axis).
        print_index(x);
        for (dimension y = 0; y < m_height; y++) {
            if (m_board[x][y] == joker) {
                // Display joker.
                cout << "\033[1mJK\033[0m";
            } else if ((x == m_position.first) && (y == m_position.second)) {
                // Display base position.
                cout << "\033[" << to_string(color_codes.at(m_board[x][y]) + foreground_color_code) << "m"
                     << zfill(to_string(min((int) moves, 99)), 2, '0') << "\033[0m";
            } else {
                // Display color.
                cout << "\033[" << to_string(color_codes.at(m_board[x][y]) + background_color_code) << "m  \033[0m";
            }
        }
        // Display right index (Y axis).
        print_index(x);
        cout << endl;
    }

    // Display lower indexes (X axis).
    cout << "  ";
    for (dimension y = 0; y < m_height; y++) print_index(y);
    cout << endl << endl;
}